

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Woop<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  Geometry *pGVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined1 (*pauVar12) [16];
  int *piVar13;
  ulong uVar14;
  RTCRayQueryContext *pRVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  long lVar19;
  undefined1 (*pauVar20) [16];
  byte bVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  uint uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined8 uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  uint uVar63;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2694;
  undefined1 local_2690 [16];
  RTCIntersectArguments *local_2680;
  RayQueryContext *local_2678;
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  RTCFilterFunctionNArguments local_2630;
  undefined1 local_2600 [16];
  Scene *local_25e8;
  ulong local_25e0;
  ulong local_25d8;
  ulong local_25d0;
  ulong local_25c8;
  undefined4 local_25c0;
  undefined4 local_25bc;
  undefined4 local_25b8;
  float local_25b4;
  float local_25b0;
  undefined4 local_25ac;
  uint local_25a8;
  uint local_25a4;
  uint local_25a0;
  undefined1 local_2590 [16];
  undefined1 local_2580 [32];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  float local_2530 [4];
  float local_2520 [4];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [2] [16];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  float local_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [16];
  float local_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2678 = context;
    auVar31._8_4_ = 0x7fffffff;
    auVar31._0_8_ = 0x7fffffff7fffffff;
    auVar31._12_4_ = 0x7fffffff;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar31 = vandps_avx((undefined1  [16])aVar2,auVar31);
    auVar36 = vshufps_avx(auVar31,auVar31,0xf5);
    auVar59 = vshufps_avx(auVar31,auVar31,0x4e);
    auVar37 = vmaxss_avx(auVar31,auVar36);
    uVar22 = 2;
    if (auVar59._0_4_ < auVar37._0_4_) {
      uVar22 = (uint)(auVar31._0_4_ <= auVar36._0_4_);
    }
    uVar27 = uVar22 - 2;
    if (uVar22 + 1 < 3) {
      uVar27 = uVar22 + 1;
    }
    uVar63 = uVar27 + 1;
    if (uVar27 + 1 == 3) {
      uVar63 = 0;
    }
    fVar1 = (float)ray->instID[(ulong)uVar22 - 0xf];
    uVar3 = uVar27;
    if (fVar1 < 0.0) {
      uVar3 = uVar63;
    }
    local_25e0 = (ulong)uVar3;
    if (fVar1 < 0.0) {
      uVar63 = uVar27;
    }
    uVar16 = (ulong)uVar63;
    uVar27 = ray->instID[local_25e0 - 0x13];
    auVar71 = ZEXT1664(CONCAT412(uVar27,CONCAT48(uVar27,CONCAT44(uVar27,uVar27))));
    auVar36 = ZEXT416((uint)fVar1);
    auVar37 = vrcpss_avx(auVar36,auVar36);
    auVar36 = vfnmadd213ss_fma(auVar36,auVar37,ZEXT416(0x40000000));
    uVar27 = ray->instID[uVar16 - 0x13];
    auVar72 = ZEXT1664(CONCAT412(uVar27,CONCAT48(uVar27,CONCAT44(uVar27,uVar27))));
    local_2450 = auVar37._0_4_ * auVar36._0_4_;
    fVar1 = local_2450 * (float)ray->instID[uVar16 - 0xf];
    uVar27 = ray->instID[(ulong)uVar22 - 0x13];
    auVar73 = ZEXT1664(CONCAT412(uVar27,CONCAT48(uVar27,CONCAT44(uVar27,uVar27))));
    local_2430 = local_2450 * (float)ray->instID[local_25e0 - 0xf];
    pauVar12 = (undefined1 (*) [16])local_2390;
    auVar37 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar36 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar59._8_4_ = 0x219392ef;
    auVar59._0_8_ = 0x219392ef219392ef;
    auVar59._12_4_ = 0x219392ef;
    auVar31 = vcmpps_avx(auVar31,auVar59,1);
    auVar31 = vblendvps_avx((undefined1  [16])aVar2,auVar59,auVar31);
    auVar59 = vrcpps_avx(auVar31);
    auVar60._8_4_ = 0x3f800000;
    auVar60._0_8_ = 0x3f8000003f800000;
    auVar60._12_4_ = 0x3f800000;
    auVar31 = vfnmadd213ps_fma(auVar31,auVar59,auVar60);
    auVar42 = vfmadd132ps_fma(auVar31,auVar59,auVar59);
    fVar50 = auVar42._0_4_;
    uStack_2398 = 0;
    local_23c0._4_4_ = fVar50;
    local_23c0._0_4_ = fVar50;
    local_23c0._8_4_ = fVar50;
    local_23c0._12_4_ = fVar50;
    local_23c0._16_4_ = fVar50;
    local_23c0._20_4_ = fVar50;
    local_23c0._24_4_ = fVar50;
    local_23c0._28_4_ = fVar50;
    auVar68 = ZEXT3264(local_23c0);
    auVar31 = vmovshdup_avx(auVar42);
    uVar55 = auVar31._0_8_;
    local_23e0._8_8_ = uVar55;
    local_23e0._0_8_ = uVar55;
    local_23e0._16_8_ = uVar55;
    local_23e0._24_8_ = uVar55;
    auVar70 = ZEXT3264(local_23e0);
    auVar59 = vshufpd_avx(auVar42,auVar42,1);
    auVar60 = vshufps_avx(auVar42,auVar42,0xaa);
    uVar55 = auVar60._0_8_;
    local_2400._8_8_ = uVar55;
    local_2400._0_8_ = uVar55;
    local_2400._16_8_ = uVar55;
    local_2400._24_8_ = uVar55;
    auVar51._0_4_ = fVar50 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar51._4_4_ = auVar42._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar51._8_4_ = auVar42._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar51._12_4_ = auVar42._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    local_25c8 = (ulong)(fVar50 < 0.0) << 5;
    uVar30 = (ulong)(auVar31._0_4_ < 0.0) << 5 | 0x40;
    auVar31 = vmovshdup_avx(auVar51);
    auVar60 = vshufps_avx(auVar51,auVar51,0xaa);
    uVar29 = (ulong)(auVar59._0_4_ < 0.0) << 5 | 0x80;
    local_25d8 = local_25c8 ^ 0x20;
    local_25d0 = uVar30;
    uVar11 = auVar36._0_4_;
    auVar35 = ZEXT3264(CONCAT428(uVar11,CONCAT424(uVar11,CONCAT420(uVar11,CONCAT416(uVar11,CONCAT412
                                                  (uVar11,CONCAT48(uVar11,CONCAT44(uVar11,uVar11))))
                                                  ))));
    uVar24 = CONCAT44(auVar51._0_4_,auVar51._0_4_);
    uVar27 = auVar31._0_4_;
    uVar63 = auVar31._4_4_;
    local_2420._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
    local_2420._8_4_ = uVar27 ^ 0x80000000;
    local_2420._12_4_ = uVar63 ^ 0x80000000;
    local_2420._16_4_ = uVar27 ^ 0x80000000;
    local_2420._20_4_ = uVar63 ^ 0x80000000;
    local_2420._24_4_ = uVar27 ^ 0x80000000;
    local_2420._28_4_ = uVar63 ^ 0x80000000;
    auVar58 = ZEXT3264(local_2420);
    uVar27 = auVar60._0_4_;
    uVar63 = auVar60._4_4_;
    local_2480._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
    local_2480._8_4_ = uVar27 ^ 0x80000000;
    local_2480._12_4_ = uVar63 ^ 0x80000000;
    local_2480._16_4_ = uVar27 ^ 0x80000000;
    local_2480._20_4_ = uVar63 ^ 0x80000000;
    local_2480._24_4_ = uVar27 ^ 0x80000000;
    local_2480._28_4_ = uVar63 ^ 0x80000000;
    auVar62 = ZEXT3264(local_2480);
    auVar54 = ZEXT3264(local_2400);
    auVar75 = ZEXT3264(CONCAT428(-auVar51._0_4_,
                                 CONCAT424(-auVar51._0_4_,
                                           CONCAT420(-auVar51._0_4_,
                                                     CONCAT416(-auVar51._0_4_,
                                                               CONCAT412(-auVar51._0_4_,
                                                                         CONCAT48(-auVar51._0_4_,
                                                                                  uVar24 ^ 
                                                  0x8000000080000000)))))));
    uVar11 = auVar37._0_4_;
    local_24a0._4_4_ = uVar11;
    local_24a0._0_4_ = uVar11;
    local_24a0._8_4_ = uVar11;
    local_24a0._12_4_ = uVar11;
    local_24a0._16_4_ = uVar11;
    local_24a0._20_4_ = uVar11;
    local_24a0._24_4_ = uVar11;
    local_24a0._28_4_ = uVar11;
    auVar65 = ZEXT3264(local_24a0);
    local_2590 = mm_lookupmask_ps._240_16_;
    fStack_242c = local_2430;
    fStack_2428 = local_2430;
    fStack_2424 = local_2430;
    local_2440._4_4_ = fVar1;
    local_2440._0_4_ = fVar1;
    local_2440._8_4_ = fVar1;
    local_2440._12_4_ = fVar1;
    fStack_244c = local_2450;
    fStack_2448 = local_2450;
    fStack_2444 = local_2450;
LAB_0199f843:
    do {
      pauVar26 = pauVar12 + -1;
      pauVar12 = pauVar12 + -1;
      if (*(float *)(*pauVar26 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar24 = *(ulong *)*pauVar12;
        while ((uVar24 & 8) == 0) {
          auVar74 = auVar75._0_32_;
          auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + local_25c8),auVar74,
                                    auVar68._0_32_);
          auVar57 = auVar58._0_32_;
          auVar37 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + local_25d0),auVar57,
                                    auVar70._0_32_);
          auVar8 = vpmaxsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar37));
          auVar53 = auVar54._0_32_;
          auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar29),auVar62._0_32_,
                                    auVar53);
          auVar9 = vpmaxsd_avx2(ZEXT1632(auVar31),auVar65._0_32_);
          local_2580 = vpmaxsd_avx2(auVar8,auVar9);
          auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + local_25d8),auVar74,
                                    auVar68._0_32_);
          auVar37 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar30 ^ 0x20)),auVar57,
                                    auVar70._0_32_);
          auVar8 = vpminsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar37));
          auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar29 ^ 0x20)),
                                    auVar62._0_32_,auVar53);
          auVar9 = vpminsd_avx2(ZEXT1632(auVar31),auVar35._0_32_);
          auVar8 = vpminsd_avx2(auVar8,auVar9);
          auVar8 = vpcmpgtd_avx2(local_2580,auVar8);
          iVar23 = vmovmskps_avx(auVar8);
          if (iVar23 == 0xff) {
            if (pauVar12 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_0199f843;
          }
          bVar21 = ~(byte)iVar23;
          uVar14 = uVar24 & 0xfffffffffffffff0;
          lVar28 = 0;
          for (uVar24 = (ulong)bVar21; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000)
          {
            lVar28 = lVar28 + 1;
          }
          uVar24 = *(ulong *)(uVar14 + lVar28 * 8);
          uVar27 = bVar21 - 1 & (uint)bVar21;
          uVar17 = (ulong)uVar27;
          if (uVar27 != 0) {
            uVar63 = *(uint *)(local_2580 + lVar28 * 4);
            lVar28 = 0;
            for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
            uVar27 = uVar27 - 1 & uVar27;
            uVar25 = (ulong)uVar27;
            uVar17 = *(ulong *)(uVar14 + lVar28 * 8);
            uVar3 = *(uint *)(local_2580 + lVar28 * 4);
            if (uVar27 == 0) {
              if (uVar63 < uVar3) {
                *(ulong *)*pauVar12 = uVar17;
                *(uint *)(*pauVar12 + 8) = uVar3;
                pauVar12 = pauVar12 + 1;
              }
              else {
                *(ulong *)*pauVar12 = uVar24;
                *(uint *)(*pauVar12 + 8) = uVar63;
                pauVar12 = pauVar12 + 1;
                uVar24 = uVar17;
              }
            }
            else {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar24;
              auVar31 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar63));
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar17;
              auVar37 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar3));
              lVar28 = 0;
              for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                lVar28 = lVar28 + 1;
              }
              uVar27 = uVar27 - 1 & uVar27;
              uVar24 = (ulong)uVar27;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = *(ulong *)(uVar14 + lVar28 * 8);
              auVar36 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_2580 + lVar28 * 4)));
              if (uVar27 == 0) {
                auVar59 = vpcmpgtd_avx(auVar37,auVar31);
                auVar60 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar37,auVar31,auVar60);
                auVar31 = vblendvps_avx(auVar31,auVar37,auVar60);
                auVar37 = vpcmpgtd_avx(auVar36,auVar59);
                auVar60 = vpshufd_avx(auVar37,0xaa);
                auVar37 = vblendvps_avx(auVar36,auVar59,auVar60);
                auVar36 = vblendvps_avx(auVar59,auVar36,auVar60);
                auVar59 = vpcmpgtd_avx(auVar36,auVar31);
                auVar60 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar36,auVar31,auVar60);
                auVar31 = vblendvps_avx(auVar31,auVar36,auVar60);
                *pauVar12 = auVar31;
                pauVar12[1] = auVar59;
                uVar24 = auVar37._0_8_;
                pauVar12 = pauVar12 + 2;
              }
              else {
                lVar28 = 0;
                for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                  lVar28 = lVar28 + 1;
                }
                uVar27 = uVar27 - 1 & uVar27;
                uVar17 = (ulong)uVar27;
                auVar45._8_8_ = 0;
                auVar45._0_8_ = *(ulong *)(uVar14 + lVar28 * 8);
                auVar59 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_2580 + lVar28 * 4)));
                if (uVar27 == 0) {
                  auVar60 = vpcmpgtd_avx(auVar37,auVar31);
                  auVar42 = vpshufd_avx(auVar60,0xaa);
                  auVar60 = vblendvps_avx(auVar37,auVar31,auVar42);
                  auVar31 = vblendvps_avx(auVar31,auVar37,auVar42);
                  auVar37 = vpcmpgtd_avx(auVar59,auVar36);
                  auVar42 = vpshufd_avx(auVar37,0xaa);
                  auVar37 = vblendvps_avx(auVar59,auVar36,auVar42);
                  auVar36 = vblendvps_avx(auVar36,auVar59,auVar42);
                  auVar59 = vpcmpgtd_avx(auVar36,auVar31);
                  auVar42 = vpshufd_avx(auVar59,0xaa);
                  auVar59 = vblendvps_avx(auVar36,auVar31,auVar42);
                  auVar31 = vblendvps_avx(auVar31,auVar36,auVar42);
                  auVar36 = vpcmpgtd_avx(auVar37,auVar60);
                  auVar42 = vpshufd_avx(auVar36,0xaa);
                  auVar36 = vblendvps_avx(auVar37,auVar60,auVar42);
                  auVar37 = vblendvps_avx(auVar60,auVar37,auVar42);
                  auVar60 = vpcmpgtd_avx(auVar59,auVar37);
                  auVar42 = vpshufd_avx(auVar60,0xaa);
                  auVar60 = vblendvps_avx(auVar59,auVar37,auVar42);
                  auVar37 = vblendvps_avx(auVar37,auVar59,auVar42);
                  *pauVar12 = auVar31;
                  pauVar12[1] = auVar37;
                  pauVar12[2] = auVar60;
                  uVar24 = auVar36._0_8_;
                  pauVar26 = pauVar12 + 3;
                }
                else {
                  *pauVar12 = auVar31;
                  pauVar12[1] = auVar37;
                  pauVar12[2] = auVar36;
                  pauVar12[3] = auVar59;
                  lVar28 = 0x30;
                  do {
                    lVar19 = lVar28;
                    lVar28 = 0;
                    for (uVar24 = uVar17; (uVar24 & 1) == 0;
                        uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                      lVar28 = lVar28 + 1;
                    }
                    uVar24 = *(ulong *)(uVar14 + lVar28 * 8);
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = uVar24;
                    auVar31 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_2580 + lVar28 * 4)));
                    *(undefined1 (*) [16])(pauVar12[1] + lVar19) = auVar31;
                    uVar17 = uVar17 - 1 & uVar17;
                    lVar28 = lVar19 + 0x10;
                  } while (uVar17 != 0);
                  pauVar26 = (undefined1 (*) [16])(pauVar12[1] + lVar19);
                  if (lVar19 + 0x10 != 0) {
                    lVar28 = 0x10;
                    pauVar18 = pauVar12;
                    do {
                      auVar31 = pauVar18[1];
                      pauVar18 = pauVar18 + 1;
                      uVar27 = vextractps_avx(auVar31,2);
                      lVar19 = lVar28;
                      do {
                        if (uVar27 <= *(uint *)(pauVar12[-1] + lVar19 + 8)) {
                          pauVar20 = (undefined1 (*) [16])(*pauVar12 + lVar19);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar12 + lVar19) =
                             *(undefined1 (*) [16])(pauVar12[-1] + lVar19);
                        lVar19 = lVar19 + -0x10;
                        pauVar20 = pauVar12;
                      } while (lVar19 != 0);
                      *pauVar20 = auVar31;
                      lVar28 = lVar28 + 0x10;
                    } while (pauVar26 != pauVar18);
                    uVar24 = *(ulong *)*pauVar26;
                  }
                }
                auVar54 = ZEXT3264(auVar53);
                auVar75 = ZEXT3264(auVar74);
                auVar58 = ZEXT3264(auVar57);
                auVar62 = ZEXT3264(local_2480);
                auVar65 = ZEXT3264(local_24a0);
                pauVar12 = pauVar26;
              }
            }
          }
        }
        uVar14 = (ulong)((uint)uVar24 & 0xf);
        if (uVar14 != 8) {
          lVar28 = 0;
          do {
            pauVar26 = (undefined1 (*) [16])(lVar28 * 0xb0 + (uVar24 & 0xfffffffffffffff0));
            auVar51 = auVar71._0_16_;
            auVar31 = vsubps_avx(pauVar26[local_25e0],auVar51);
            auVar45 = auVar72._0_16_;
            auVar37 = vsubps_avx(pauVar26[uVar16],auVar45);
            auVar38 = auVar73._0_16_;
            auVar59 = vsubps_avx(pauVar26[uVar22],auVar38);
            auVar36 = vsubps_avx(pauVar26[local_25e0 + 3],auVar51);
            auVar60 = vsubps_avx(pauVar26[uVar16 + 3],auVar45);
            auVar42 = vsubps_avx(pauVar26[(ulong)uVar22 + 3],auVar38);
            auVar51 = vsubps_avx(pauVar26[local_25e0 + 6],auVar51);
            auVar45 = vsubps_avx(pauVar26[uVar16 + 6],auVar45);
            auVar38 = vsubps_avx(pauVar26[(ulong)uVar22 + 6],auVar38);
            auVar10._4_4_ = fStack_242c;
            auVar10._0_4_ = local_2430;
            auVar10._8_4_ = fStack_2428;
            auVar10._12_4_ = fStack_2424;
            auVar31 = vfnmadd231ps_fma(auVar31,auVar59,auVar10);
            auVar37 = vfnmadd231ps_fma(auVar37,auVar59,local_2440);
            auVar36 = vfnmadd231ps_fma(auVar36,auVar42,auVar10);
            auVar60 = vfnmadd231ps_fma(auVar60,auVar42,local_2440);
            auVar51 = vfnmadd231ps_fma(auVar51,auVar38,auVar10);
            auVar45 = vfnmadd231ps_fma(auVar45,auVar38,local_2440);
            auVar32._0_4_ = auVar60._0_4_ * auVar51._0_4_;
            auVar32._4_4_ = auVar60._4_4_ * auVar51._4_4_;
            auVar32._8_4_ = auVar60._8_4_ * auVar51._8_4_;
            auVar32._12_4_ = auVar60._12_4_ * auVar51._12_4_;
            auVar39._0_4_ = auVar36._0_4_ * auVar45._0_4_;
            auVar39._4_4_ = auVar36._4_4_ * auVar45._4_4_;
            auVar39._8_4_ = auVar36._8_4_ * auVar45._8_4_;
            auVar39._12_4_ = auVar36._12_4_ * auVar45._12_4_;
            auVar40._0_4_ = auVar31._0_4_ * auVar45._0_4_;
            auVar40._4_4_ = auVar31._4_4_ * auVar45._4_4_;
            auVar40._8_4_ = auVar31._8_4_ * auVar45._8_4_;
            auVar40._12_4_ = auVar31._12_4_ * auVar45._12_4_;
            auVar56._0_4_ = auVar37._0_4_ * auVar51._0_4_;
            auVar56._4_4_ = auVar37._4_4_ * auVar51._4_4_;
            auVar56._8_4_ = auVar37._8_4_ * auVar51._8_4_;
            auVar56._12_4_ = auVar37._12_4_ * auVar51._12_4_;
            auVar61._0_4_ = auVar37._0_4_ * auVar36._0_4_;
            auVar61._4_4_ = auVar37._4_4_ * auVar36._4_4_;
            auVar61._8_4_ = auVar37._8_4_ * auVar36._8_4_;
            auVar61._12_4_ = auVar37._12_4_ * auVar36._12_4_;
            auVar64._0_4_ = auVar60._0_4_ * auVar31._0_4_;
            auVar64._4_4_ = auVar60._4_4_ * auVar31._4_4_;
            auVar64._8_4_ = auVar60._8_4_ * auVar31._8_4_;
            auVar64._12_4_ = auVar60._12_4_ * auVar31._12_4_;
            auVar37 = vcmpps_avx(auVar32,auVar39,5);
            auVar31 = vcmpps_avx(auVar40,auVar56,5);
            auVar36 = vcmpps_avx(auVar61,auVar64,5);
            auVar31 = vandps_avx(auVar31,auVar36);
            auVar31 = vandps_avx(auVar31,auVar37);
            auVar37 = vcmpps_avx(auVar40,auVar56,2);
            auVar36 = vcmpps_avx(auVar61,auVar64,2);
            auVar37 = vandps_avx(auVar37,auVar36);
            auVar36 = vcmpps_avx(auVar32,auVar39,2);
            auVar37 = vandps_avx(auVar37,auVar36);
            auVar31 = vorps_avx(auVar37,auVar31);
            auVar37 = local_2590 & auVar31;
            if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar37[0xf] < '\0') {
              auVar31 = vandps_avx(auVar31,local_2590);
              local_2580._0_16_ = vsubps_avx(auVar32,auVar39);
              local_2580._16_16_ = vsubps_avx(auVar40,auVar56);
              auVar60 = vsubps_avx(auVar61,auVar64);
              auVar41._0_4_ = auVar60._0_4_ + local_2580._0_4_ + local_2580._16_4_;
              auVar41._4_4_ = auVar60._4_4_ + local_2580._4_4_ + local_2580._20_4_;
              auVar41._8_4_ = auVar60._8_4_ + local_2580._8_4_ + local_2580._24_4_;
              auVar41._12_4_ = auVar60._12_4_ + local_2580._12_4_ + local_2580._28_4_;
              auVar37 = vcmpps_avx(auVar41,_DAT_01f7aa10,4);
              auVar36 = vrcpps_avx(auVar41);
              auVar66._8_4_ = 0x3f800000;
              auVar66._0_8_ = 0x3f8000003f800000;
              auVar66._12_4_ = 0x3f800000;
              auVar51 = vfnmadd213ps_fma(auVar41,auVar36,auVar66);
              local_2550 = vfmadd132ps_fma(auVar51,auVar36,auVar36);
              auVar43._0_4_ = local_2450 * auVar59._0_4_;
              auVar43._4_4_ = fStack_244c * auVar59._4_4_;
              auVar43._8_4_ = fStack_2448 * auVar59._8_4_;
              auVar43._12_4_ = fStack_2444 * auVar59._12_4_;
              auVar46._0_4_ = local_2450 * auVar42._0_4_;
              auVar46._4_4_ = fStack_244c * auVar42._4_4_;
              auVar46._8_4_ = fStack_2448 * auVar42._8_4_;
              auVar46._12_4_ = fStack_2444 * auVar42._12_4_;
              auVar49._0_4_ = auVar60._0_4_ * local_2450 * auVar38._0_4_;
              auVar49._4_4_ = auVar60._4_4_ * fStack_244c * auVar38._4_4_;
              auVar49._8_4_ = auVar60._8_4_ * fStack_2448 * auVar38._8_4_;
              auVar49._12_4_ = auVar60._12_4_ * fStack_2444 * auVar38._12_4_;
              auVar36 = vfmadd231ps_fma(auVar49,local_2580._16_16_,auVar46);
              auVar36 = vfmadd231ps_fma(auVar36,local_2580._0_16_,auVar43);
              fVar50 = local_2550._0_4_;
              auVar69._0_4_ = auVar36._0_4_ * fVar50;
              fVar5 = local_2550._4_4_;
              auVar69._4_4_ = auVar36._4_4_ * fVar5;
              fVar6 = local_2550._8_4_;
              auVar69._8_4_ = auVar36._8_4_ * fVar6;
              fVar7 = local_2550._12_4_;
              auVar69._12_4_ = auVar36._12_4_ * fVar7;
              uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar44._4_4_ = uVar11;
              auVar44._0_4_ = uVar11;
              auVar44._8_4_ = uVar11;
              auVar44._12_4_ = uVar11;
              auVar36 = vcmpps_avx(auVar44,auVar69,1);
              auVar37 = vandps_avx(auVar37,auVar36);
              fVar1 = (ray->super_RayK<1>).tfar;
              auVar47._4_4_ = fVar1;
              auVar47._0_4_ = fVar1;
              auVar47._8_4_ = fVar1;
              auVar47._12_4_ = fVar1;
              auVar36 = vcmpps_avx(auVar69,auVar47,2);
              auVar37 = vandps_avx(auVar37,auVar36);
              auVar36 = auVar31 & auVar37;
              if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar36[0xf] < '\0') {
                local_2600._0_4_ = (ray->super_RayK<1>).tfar;
                local_2600._4_4_ = (ray->super_RayK<1>).mask;
                local_2600._8_4_ = (ray->super_RayK<1>).id;
                local_2600._12_4_ = (ray->super_RayK<1>).flags;
                auVar31 = vandps_avx(auVar37,auVar31);
                auVar37 = vsubps_avx(pauVar26[6],*pauVar26);
                auVar36 = vsubps_avx(pauVar26[7],pauVar26[1]);
                auVar59 = vsubps_avx(*pauVar26,pauVar26[3]);
                auVar60 = vsubps_avx(pauVar26[1],pauVar26[4]);
                auVar42 = vsubps_avx(pauVar26[8],pauVar26[2]);
                auVar51 = vsubps_avx(pauVar26[2],pauVar26[5]);
                auVar67._0_4_ = auVar42._0_4_ * auVar60._0_4_;
                auVar67._4_4_ = auVar42._4_4_ * auVar60._4_4_;
                auVar67._8_4_ = auVar42._8_4_ * auVar60._8_4_;
                auVar67._12_4_ = auVar42._12_4_ * auVar60._12_4_;
                local_2500 = vfmsub231ps_fma(auVar67,auVar36,auVar51);
                auVar52._0_4_ = auVar51._0_4_ * auVar37._0_4_;
                auVar52._4_4_ = auVar51._4_4_ * auVar37._4_4_;
                auVar52._8_4_ = auVar51._8_4_ * auVar37._8_4_;
                auVar52._12_4_ = auVar51._12_4_ * auVar37._12_4_;
                local_24f0 = vfmsub231ps_fma(auVar52,auVar59,auVar42);
                auVar48._0_4_ = auVar36._0_4_ * auVar59._0_4_;
                auVar48._4_4_ = auVar36._4_4_ * auVar59._4_4_;
                auVar48._8_4_ = auVar36._8_4_ * auVar59._8_4_;
                auVar48._12_4_ = auVar36._12_4_ * auVar59._12_4_;
                local_24e0[0] = vfmsub231ps_fma(auVar48,auVar37,auVar60);
                local_2560 = auVar69;
                local_2540 = auVar31;
                local_2690 = auVar31;
                local_2510 = auVar69;
                local_2530[0] = local_2580._0_4_ * fVar50;
                local_2530[1] = local_2580._4_4_ * fVar5;
                local_2530[2] = local_2580._8_4_ * fVar6;
                local_2530[3] = local_2580._12_4_ * fVar7;
                local_2520[0] = fVar50 * local_2580._16_4_;
                local_2520[1] = fVar5 * local_2580._20_4_;
                local_2520[2] = fVar6 * local_2580._24_4_;
                local_2520[3] = fVar7 * local_2580._28_4_;
                auVar33._8_4_ = 0x7f800000;
                auVar33._0_8_ = 0x7f8000007f800000;
                auVar33._12_4_ = 0x7f800000;
                auVar37 = vblendvps_avx(auVar33,auVar69,auVar31);
                auVar36 = vshufps_avx(auVar37,auVar37,0xb1);
                auVar36 = vminps_avx(auVar36,auVar37);
                auVar59 = vshufpd_avx(auVar36,auVar36,1);
                auVar36 = vminps_avx(auVar59,auVar36);
                auVar37 = vcmpps_avx(auVar37,auVar36,0);
                auVar36 = auVar31 & auVar37;
                local_25e8 = local_2678->scene;
                if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar36[0xf] < '\0') {
                  auVar31 = vandps_avx(auVar37,auVar31);
                }
                uVar27 = vextractps_avx(local_2600,1);
                uVar11 = vmovmskps_avx(auVar31);
                piVar13 = (int *)0x0;
                for (uVar17 = CONCAT44((int)((ulong)local_2678->scene >> 0x20),uVar11);
                    (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                  piVar13 = (int *)((long)piVar13 + 1);
                }
                do {
                  local_2660 = auVar73._0_16_;
                  local_2650 = auVar72._0_16_;
                  local_2640 = auVar71._0_16_;
                  uVar63 = *(uint *)(pauVar26[9] + (long)piVar13 * 4);
                  pGVar4 = (local_25e8->geometries).items[uVar63].ptr;
                  if ((pGVar4->mask & uVar27) == 0) {
                    *(undefined4 *)(local_2690 + (long)piVar13 * 4) = 0;
                  }
                  else {
                    local_2680 = local_2678->args;
                    local_24c0 = auVar75._0_32_;
                    if (local_2678->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar15 = local_2678->user;
                      if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar1 = local_2530[(long)piVar13];
                        fVar50 = local_2520[(long)piVar13];
                        (ray->super_RayK<1>).tfar = *(float *)(local_2510 + (long)piVar13 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_2500 + (long)piVar13 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_24f0 + (long)piVar13 * 4);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_24e0[0] + (long)piVar13 * 4);
                        ray->u = fVar1;
                        ray->v = fVar50;
                        ray->primID = *(uint *)(pauVar26[10] + (long)piVar13 * 4);
                        ray->geomID = uVar63;
                        ray->instID[0] = pRVar15->instID[0];
                        ray->instPrimID[0] = pRVar15->instPrimID[0];
                        break;
                      }
                      local_2670 = auVar69;
                    }
                    else {
                      local_2670 = auVar69;
                      pRVar15 = local_2678->user;
                    }
                    local_25c0 = *(undefined4 *)(local_2500 + (long)piVar13 * 4);
                    local_25bc = *(undefined4 *)(local_24f0 + (long)piVar13 * 4);
                    local_25b8 = *(undefined4 *)(local_24e0[0] + (long)piVar13 * 4);
                    local_25b4 = local_2530[(long)piVar13];
                    local_25b0 = local_2520[(long)piVar13];
                    local_25ac = *(undefined4 *)(pauVar26[10] + (long)piVar13 * 4);
                    local_25a8 = uVar63;
                    local_25a4 = pRVar15->instID[0];
                    local_25a0 = pRVar15->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2510 + (long)piVar13 * 4);
                    local_2694 = -1;
                    local_2630.valid = &local_2694;
                    local_2630.geometryUserPtr = pGVar4->userPtr;
                    local_2630.context = pRVar15;
                    local_2630.ray = (RTCRayN *)ray;
                    local_2630.hit = (RTCHitN *)&local_25c0;
                    local_2630.N = 1;
                    local_2670 = auVar69;
                    if (((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar4->intersectionFilterN)(&local_2630), *local_2630.valid != 0)) &&
                       ((local_2680->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_2680->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((pGVar4->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*local_2680->filter)(&local_2630), *local_2630.valid != 0)))))) {
                      (((Vec3f *)((long)local_2630.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2630.hit;
                      (((Vec3f *)((long)local_2630.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2630.hit + 4);
                      (((Vec3f *)((long)local_2630.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2630.hit + 8);
                      *(float *)((long)local_2630.ray + 0x3c) = *(float *)(local_2630.hit + 0xc);
                      *(float *)((long)local_2630.ray + 0x40) = *(float *)(local_2630.hit + 0x10);
                      *(float *)((long)local_2630.ray + 0x44) = *(float *)(local_2630.hit + 0x14);
                      *(float *)((long)local_2630.ray + 0x48) = *(float *)(local_2630.hit + 0x18);
                      *(float *)((long)local_2630.ray + 0x4c) = *(float *)(local_2630.hit + 0x1c);
                      *(float *)((long)local_2630.ray + 0x50) = *(float *)(local_2630.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_2600._0_4_;
                    }
                    *(undefined4 *)(local_2690 + (long)piVar13 * 4) = 0;
                    fVar1 = (ray->super_RayK<1>).tfar;
                    auVar34._4_4_ = fVar1;
                    auVar34._0_4_ = fVar1;
                    auVar34._8_4_ = fVar1;
                    auVar34._12_4_ = fVar1;
                    auVar31 = vcmpps_avx(local_2670,auVar34,2);
                    local_2690 = vandps_avx(auVar31,local_2690);
                    local_2600._0_4_ = (ray->super_RayK<1>).tfar;
                    local_2600._4_4_ = (ray->super_RayK<1>).mask;
                    local_2600._8_4_ = (ray->super_RayK<1>).id;
                    local_2600._12_4_ = (ray->super_RayK<1>).flags;
                    uVar27 = vextractps_avx(local_2600,1);
                    auVar71 = ZEXT1664(local_2640);
                    auVar72 = ZEXT1664(local_2650);
                    auVar73 = ZEXT1664(local_2660);
                    auVar75 = ZEXT3264(local_24c0);
                    auVar69 = local_2670;
                  }
                  if ((((local_2690 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2690 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2690 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2690[0xf]) break;
                  local_2640 = auVar71._0_16_;
                  local_2650 = auVar72._0_16_;
                  local_2660 = auVar73._0_16_;
                  local_24c0 = auVar75._0_32_;
                  local_2670 = auVar69;
                  BVHNIntersector1<8,1,false,embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Woop<4,true>>>
                  ::intersect(&local_2630);
                  auVar75 = ZEXT3264(local_24c0);
                  auVar73 = ZEXT1664(local_2660);
                  auVar72 = ZEXT1664(local_2650);
                  auVar71 = ZEXT1664(local_2640);
                  piVar13 = local_2630.valid;
                  auVar69 = local_2670;
                } while( true );
              }
            }
            lVar28 = lVar28 + 1;
          } while (lVar28 != uVar14 - 8);
        }
        fVar1 = (ray->super_RayK<1>).tfar;
        auVar35 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412
                                                  (fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))))
        ;
        auVar68 = ZEXT3264(local_23c0);
        auVar70 = ZEXT3264(local_23e0);
        auVar54 = ZEXT3264(local_2400);
        auVar58 = ZEXT3264(local_2420);
        auVar62 = ZEXT3264(local_2480);
        auVar65 = ZEXT3264(local_24a0);
      }
    } while (pauVar12 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }